

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhs(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *newRhs,bool scale)

{
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  long lVar2;
  undefined7 in_register_00000011;
  long lVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  int i;
  ulong uVar7;
  byte bVar8;
  undefined4 local_130 [28];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined4 local_b0 [28];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar8 = 0;
  if ((int)CONCAT71(in_register_00000011,scale) != 0) {
    lVar3 = 0x78;
    for (uVar7 = 0;
        (long)uVar7 <
        (long)(int)((ulong)((long)(this->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).right.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).right.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 7); uVar7 = uVar7 + 1
        ) {
      pSVar1 = this->lp_scaler;
      puVar6 = (undefined8 *)
               ((long)(((newRhs->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar3
               );
      puVar4 = puVar6 + -0xf;
      puVar5 = local_130;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *(undefined4 *)puVar4;
        puVar4 = (undefined8 *)((long)puVar4 + (ulong)bVar8 * -8 + 4);
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      }
      local_c0 = *(undefined4 *)(puVar6 + -1);
      local_bc = *(undefined1 *)((long)puVar6 + -4);
      local_b8 = *puVar6;
      (*pSVar1->_vptr_SPxScaler[0x2e])(local_b0,pSVar1,this,uVar7 & 0xffffffff);
      puVar4 = (undefined8 *)
               ((long)(((this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar3
               );
      puVar5 = local_b0;
      puVar6 = puVar4 + -0xf;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined4 *)puVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + (ulong)bVar8 * -8 + 4);
      }
      *(undefined4 *)(puVar4 + -1) = local_40;
      *(undefined1 *)((long)puVar4 + -4) = local_3c;
      *puVar4 = local_38;
      lVar3 = lVar3 + 0x80;
    }
    return;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right,newRhs);
  return;
}

Assistant:

virtual void changeRhs(const VectorBase<R>& newRhs, bool scale = false)
   {
      assert(rhs().dim() == newRhs.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < rhs().dim(); i++)
            LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs[i]);
      }
      else
         LPRowSetBase<R>::rhs_w() = newRhs;

      assert(isConsistent());
   }